

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O0

void __thiscall RayTracer::run(RayTracer *this,Scene *scene)

{
  int iVar1;
  int iVar2;
  Camera *this_00;
  ostream *this_01;
  void *this_02;
  allocator local_99;
  string local_98 [32];
  Vector3 local_78;
  undefined1 local_60 [8];
  Color color;
  Vector3 dir;
  int j;
  int i;
  int h;
  int w;
  Camera *camera;
  Scene *scene_local;
  RayTracer *this_local;
  
  this->m_scene = scene;
  this_00 = Scene::getCamera(scene);
  iVar1 = Camera::getW(this_00);
  iVar2 = Camera::getH(this_00);
  for (dir.z._4_4_ = 0; dir.z._4_4_ < iVar1; dir.z._4_4_ = dir.z._4_4_ + 1) {
    for (dir.z._0_4_ = 0; dir.z._0_4_ < iVar2; dir.z._0_4_ = dir.z._0_4_ + 1) {
      if (dir.z._0_4_ == 0) {
        this_01 = std::operator<<((ostream *)&std::cout,"column ");
        this_02 = (void *)std::ostream::operator<<(this_01,dir.z._4_4_);
        std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      }
      Camera::emit((Vector3 *)&color.b,this_00,dir.z._4_4_,dir.z._0_4_);
      Camera::getEye(&local_78,this_00);
      m_rayTraceing((Color *)local_60,this,&local_78,(Vector3 *)&color.b,1.0,1);
      Camera::setColor(this_00,dir.z._4_4_,dir.z._0_4_,(Color *)local_60);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"output.bmp",&local_99);
  Camera::print(this_00,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return;
}

Assistant:

void RayTracer::run(Scene* scene)
{
    m_scene = scene;
    Camera* camera = scene->getCamera();
    int w = camera->getW(), h = camera->getH();

    for (int i = 0; i < w; i++)
        for (int j = 0; j < h; j++)
        {
            if (!j) cout << "column " << i << endl;
            Vector3 dir = camera->emit(i, j);
            Color color = m_rayTraceing(camera->getEye(), dir, 1, 1);
            camera->setColor(i, j, color);
        }

    camera->print("output.bmp");
}